

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

int luv_getnameinfo(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  uv_getnameinfo_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  code *getnameinfo_cb;
  char *ip;
  sockaddr_storage addr;
  
  luaL_checktype(L,1,5);
  addr.__ss_padding[0x6e] = '\0';
  addr.__ss_padding[0x6f] = '\0';
  addr.__ss_padding[0x70] = '\0';
  addr.__ss_padding[0x71] = '\0';
  addr.__ss_padding[0x72] = '\0';
  addr.__ss_padding[0x73] = '\0';
  addr.__ss_padding[0x74] = '\0';
  addr.__ss_padding[0x75] = '\0';
  addr.__ss_align = 0;
  addr.__ss_padding[0x5e] = '\0';
  addr.__ss_padding[0x5f] = '\0';
  addr.__ss_padding[0x60] = '\0';
  addr.__ss_padding[0x61] = '\0';
  addr.__ss_padding[0x62] = '\0';
  addr.__ss_padding[99] = '\0';
  addr.__ss_padding[100] = '\0';
  addr.__ss_padding[0x65] = '\0';
  addr.__ss_padding[0x66] = '\0';
  addr.__ss_padding[0x67] = '\0';
  addr.__ss_padding[0x68] = '\0';
  addr.__ss_padding[0x69] = '\0';
  addr.__ss_padding[0x6a] = '\0';
  addr.__ss_padding[0x6b] = '\0';
  addr.__ss_padding[0x6c] = '\0';
  addr.__ss_padding[0x6d] = '\0';
  addr.__ss_padding[0x4e] = '\0';
  addr.__ss_padding[0x4f] = '\0';
  addr.__ss_padding[0x50] = '\0';
  addr.__ss_padding[0x51] = '\0';
  addr.__ss_padding[0x52] = '\0';
  addr.__ss_padding[0x53] = '\0';
  addr.__ss_padding[0x54] = '\0';
  addr.__ss_padding[0x55] = '\0';
  addr.__ss_padding[0x56] = '\0';
  addr.__ss_padding[0x57] = '\0';
  addr.__ss_padding[0x58] = '\0';
  addr.__ss_padding[0x59] = '\0';
  addr.__ss_padding[0x5a] = '\0';
  addr.__ss_padding[0x5b] = '\0';
  addr.__ss_padding[0x5c] = '\0';
  addr.__ss_padding[0x5d] = '\0';
  addr.__ss_padding[0x3e] = '\0';
  addr.__ss_padding[0x3f] = '\0';
  addr.__ss_padding[0x40] = '\0';
  addr.__ss_padding[0x41] = '\0';
  addr.__ss_padding[0x42] = '\0';
  addr.__ss_padding[0x43] = '\0';
  addr.__ss_padding[0x44] = '\0';
  addr.__ss_padding[0x45] = '\0';
  addr.__ss_padding[0x46] = '\0';
  addr.__ss_padding[0x47] = '\0';
  addr.__ss_padding[0x48] = '\0';
  addr.__ss_padding[0x49] = '\0';
  addr.__ss_padding[0x4a] = '\0';
  addr.__ss_padding[0x4b] = '\0';
  addr.__ss_padding[0x4c] = '\0';
  addr.__ss_padding[0x4d] = '\0';
  addr.__ss_padding[0x2e] = '\0';
  addr.__ss_padding[0x2f] = '\0';
  addr.__ss_padding[0x30] = '\0';
  addr.__ss_padding[0x31] = '\0';
  addr.__ss_padding[0x32] = '\0';
  addr.__ss_padding[0x33] = '\0';
  addr.__ss_padding[0x34] = '\0';
  addr.__ss_padding[0x35] = '\0';
  addr.__ss_padding[0x36] = '\0';
  addr.__ss_padding[0x37] = '\0';
  addr.__ss_padding[0x38] = '\0';
  addr.__ss_padding[0x39] = '\0';
  addr.__ss_padding[0x3a] = '\0';
  addr.__ss_padding[0x3b] = '\0';
  addr.__ss_padding[0x3c] = '\0';
  addr.__ss_padding[0x3d] = '\0';
  addr.__ss_padding[0x1e] = '\0';
  addr.__ss_padding[0x1f] = '\0';
  addr.__ss_padding[0x20] = '\0';
  addr.__ss_padding[0x21] = '\0';
  addr.__ss_padding[0x22] = '\0';
  addr.__ss_padding[0x23] = '\0';
  addr.__ss_padding[0x24] = '\0';
  addr.__ss_padding[0x25] = '\0';
  addr.__ss_padding[0x26] = '\0';
  addr.__ss_padding[0x27] = '\0';
  addr.__ss_padding[0x28] = '\0';
  addr.__ss_padding[0x29] = '\0';
  addr.__ss_padding[0x2a] = '\0';
  addr.__ss_padding[0x2b] = '\0';
  addr.__ss_padding[0x2c] = '\0';
  addr.__ss_padding[0x2d] = '\0';
  addr.__ss_padding[0xe] = '\0';
  addr.__ss_padding[0xf] = '\0';
  addr.__ss_padding[0x10] = '\0';
  addr.__ss_padding[0x11] = '\0';
  addr.__ss_padding[0x12] = '\0';
  addr.__ss_padding[0x13] = '\0';
  addr.__ss_padding[0x14] = '\0';
  addr.__ss_padding[0x15] = '\0';
  addr.__ss_padding[0x16] = '\0';
  addr.__ss_padding[0x17] = '\0';
  addr.__ss_padding[0x18] = '\0';
  addr.__ss_padding[0x19] = '\0';
  addr.__ss_padding[0x1a] = '\0';
  addr.__ss_padding[0x1b] = '\0';
  addr.__ss_padding[0x1c] = '\0';
  addr.__ss_padding[0x1d] = '\0';
  addr.ss_family = 0;
  addr.__ss_padding[0] = '\0';
  addr.__ss_padding[1] = '\0';
  addr.__ss_padding[2] = '\0';
  addr.__ss_padding[3] = '\0';
  addr.__ss_padding[4] = '\0';
  addr.__ss_padding[5] = '\0';
  addr.__ss_padding[6] = '\0';
  addr.__ss_padding[7] = '\0';
  addr.__ss_padding[8] = '\0';
  addr.__ss_padding[9] = '\0';
  addr.__ss_padding[10] = '\0';
  addr.__ss_padding[0xb] = '\0';
  addr.__ss_padding[0xc] = '\0';
  addr.__ss_padding[0xd] = '\0';
  lua_getfield(L,1,"ip");
  iVar1 = lua_isstring(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      luaL_argerror(L,1,"ip property must be string if set");
    }
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
  }
  lua_settop(L,-2);
  lua_getfield(L,1,"port");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar2 = lua_type(L,-1);
    iVar1 = 0;
    if (iVar2 != 0) {
      luaL_argerror(L,1,"port property must be integer if set");
    }
  }
  else {
    lVar4 = lua_tointegerx(L,-1,(int *)0x0);
    iVar1 = (int)lVar4;
  }
  lua_settop(L,-2);
  if (iVar1 != 0 || pcVar3 != (char *)0x0) {
    ip = "0.0.0.0";
    if (pcVar3 != (char *)0x0) {
      ip = pcVar3;
    }
    iVar2 = uv_ip4_addr(ip,iVar1,(sockaddr_in *)&addr);
    if (iVar2 == 0) {
      addr.ss_family = 2;
    }
    else {
      iVar1 = uv_ip6_addr(ip,iVar1,(sockaddr_in6 *)&addr);
      if (iVar1 != 0) {
        iVar1 = luaL_argerror(L,1,"Invalid ip address or port");
        return iVar1;
      }
      addr.ss_family = 10;
    }
  }
  lua_getfield(L,1,"family");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luaL_argerror(L,1,"family must be string if set");
      }
    }
    else {
      pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar1 = luv_af_string_to_num(pcVar3);
      addr.ss_family = (sa_family_t)iVar1;
    }
  }
  else {
    lVar4 = lua_tointegerx(L,-1,(int *)0x0);
    addr.ss_family = (sa_family_t)lVar4;
  }
  lua_settop(L,-2);
  iVar1 = luv_check_continuation(L,2);
  req = (uv_getnameinfo_t *)lua_newuserdata(L,0x528);
  plVar5 = luv_setup_req(L,iVar1);
  req->data = plVar5;
  loop = luv_loop(L);
  getnameinfo_cb = (uv_getnameinfo_cb)0x0;
  if (iVar1 != -2) {
    getnameinfo_cb = luv_getnameinfo_cb;
  }
  iVar2 = uv_getnameinfo(loop,req,getnameinfo_cb,(sockaddr *)&addr,0);
  if (iVar2 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    lua_settop(L,-2);
    luv_error(L,iVar2);
    iVar2 = 3;
  }
  else {
    iVar2 = 1;
    if (iVar1 == -2) {
      lua_settop(L,-2);
      lua_pushstring(L,req->host);
      lua_pushstring(L,req->service);
      luv_cleanup_req(L,(luv_req_t *)req->data);
      iVar2 = 2;
    }
  }
  return iVar2;
}

Assistant:

static int luv_getnameinfo(lua_State* L) {
  uv_getnameinfo_t* req;
  struct sockaddr_storage addr;
  const char* ip = NULL;
  int flags = 0;
  int ret, ref, port = 0;
  luv_ctx_t* ctx = luv_context(L);

  luaL_checktype(L, 1, LUA_TTABLE);
  memset(&addr, 0, sizeof(addr));

  lua_getfield(L, 1, "ip");
  if (lua_isstring(L, -1)) {
    ip = lua_tostring(L, -1);
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "ip property must be string if set");
  }
  lua_pop(L, 1);

  lua_getfield(L, 1, "port");
  if (lua_isnumber(L, -1)) {
    port = lua_tointeger(L, -1);
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "port property must be integer if set");
  }
  lua_pop(L, 1);

  if (ip || port) {
    if (!ip) ip = "0.0.0.0";
    if (!uv_ip4_addr(ip, port, (struct sockaddr_in*)&addr)) {
      addr.ss_family = AF_INET;
    }
    else if (!uv_ip6_addr(ip, port, (struct sockaddr_in6*)&addr)) {
      addr.ss_family = AF_INET6;
    }
    else {
      return luaL_argerror(L, 1, "Invalid ip address or port");
    }
  }

  lua_getfield(L, 1, "family");
  if (lua_isnumber(L, -1)) {
    addr.ss_family = lua_tointeger(L, -1);
  }
  else if (lua_isstring(L, -1)) {
    addr.ss_family = luv_af_string_to_num(lua_tostring(L, -1));
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "family must be string if set");
  }
  lua_pop(L, 1);

  ref = luv_check_continuation(L, 2);

  req = (uv_getnameinfo_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);

  ret = uv_getnameinfo(ctx->loop, req, ref == LUA_NOREF ? NULL : luv_getnameinfo_cb, (struct sockaddr*)&addr, flags);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  if (ref == LUA_NOREF) {
    lua_pop(L, 1);
    lua_pushstring(L, req->host);
    lua_pushstring(L, req->service);
    luv_cleanup_req(L, (luv_req_t*)req->data);
    return 2;
  }
  return 1;
}